

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O2

void __thiscall BCL::write<int>(BCL *this,int *src,GlobalPtr<int> dst,size_t size)

{
  int *__dest;
  debug_error *pdVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  GlobalPtr<int> dst_local;
  MPI_Request request;
  
  dst_local.ptr = dst.rank;
  dst_local.rank = (size_t)src;
  if (my_nprocs < src) {
    pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string((string *)&request,(unsigned_long)src);
    std::operator+(&local_90,"BCL write(): request to write to rank ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request);
    std::operator+(&local_70,&local_90,", which does not exist");
    debug_error::debug_error(pdVar1,&local_70);
    __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
  }
  if (my_rank == src) {
    __dest = GlobalPtr<int>::local(&dst_local);
    memcpy(__dest,this,dst.ptr << 2);
  }
  else {
    iVar2 = (int)dst.ptr << 2;
    iVar2 = MPI_Rput(this,iVar2,&ompi_mpi_char,(ulong)src & 0xffffffff,dst_local.ptr,iVar2,
                     &ompi_mpi_char,win,&request);
    if (iVar2 != 0) {
      pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_90,iVar2);
      std::operator+(&local_70,"BCL write(): MPI_Rput return error code.",&local_90);
      debug_error::debug_error(pdVar1,&local_70);
      __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
    }
    iVar2 = MPI_Wait(&request,0);
    if (iVar2 != 0) {
      pdVar1 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_90,iVar2);
      std::operator+(&local_70,"BCL write(): MPI_Wait return error code ",&local_90);
      debug_error::debug_error(pdVar1,&local_70);
      __cxa_throw(pdVar1,&debug_error::typeinfo,debug_error::~debug_error);
    }
  }
  return;
}

Assistant:

inline void write(const T *src, GlobalPtr<T> dst, size_t size) {
  BCL_DEBUG(
    if (dst.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL write(): request to write to rank " +
                        std::to_string(dst.rank) + ", which does not exist");
    }
  )
  if (dst.rank == BCL::rank()) {
    std::memcpy(dst.local(), src, size*sizeof(T));
  } else {
    MPI_Request request;

    int error_code = MPI_Rput(src, size*sizeof(T), MPI_CHAR,
                              dst.rank, dst.ptr, size*sizeof(T), MPI_CHAR,
                              BCL::win, &request);
    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Rput return error code." + std::to_string(error_code));
            }
    )

    error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Wait return error code " + std::to_string(error_code));
            }
    )
  }
}